

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

int VP8LBuildHuffmanTable
              (HuffmanTables *root_table,int root_bits,int *code_lengths,int code_lengths_size)

{
  long *plVar1;
  void *pvVar2;
  int in_ECX;
  long in_RDI;
  uint16_t *sorted_1;
  uint16_t sorted [512];
  HuffmanTablesSegment *next;
  int segment_size;
  int total_size;
  int local_444;
  size_t in_stack_fffffffffffffbc0;
  uint64_t in_stack_fffffffffffffbc8;
  uint16_t *in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc84;
  int *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc94;
  HuffmanCode *in_stack_fffffffffffffc98;
  int local_4;
  
  local_4 = BuildHuffmanTable(in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                              in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                              in_stack_fffffffffffffc78);
  if (local_4 == 0) {
    return 0;
  }
  if (in_RDI == 0) {
    return local_4;
  }
  if ((ulong)(**(long **)(in_RDI + 0x20) + (long)*(int *)(*(long *)(in_RDI + 0x20) + 0x18) * 4) <=
      (ulong)(*(long *)(*(long *)(in_RDI + 0x20) + 8) + (long)local_4 * 4)) {
    local_444 = *(int *)(*(long *)(in_RDI + 0x20) + 0x18);
    plVar1 = (long *)WebPSafeMalloc(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    if (plVar1 == (long *)0x0) {
      return 0;
    }
    if (local_444 < local_4) {
      local_444 = local_4;
    }
    *(int *)(plVar1 + 3) = local_444;
    pvVar2 = WebPSafeMalloc(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    *plVar1 = (long)pvVar2;
    if (*plVar1 == 0) {
      WebPSafeFree((void *)0x1595a3);
      return 0;
    }
    plVar1[1] = *plVar1;
    plVar1[2] = 0;
    *(long **)(*(long *)(in_RDI + 0x20) + 0x10) = plVar1;
    *(long **)(in_RDI + 0x20) = plVar1;
  }
  if (in_ECX < 0x201) {
    BuildHuffmanTable(in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc88,
                      in_stack_fffffffffffffc84,in_stack_fffffffffffffc78);
  }
  else {
    pvVar2 = WebPSafeMalloc(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    if (pvVar2 == (void *)0x0) {
      local_4 = 0;
    }
    else {
      BuildHuffmanTable(in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                        in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
                        in_stack_fffffffffffffc78);
      WebPSafeFree((void *)0x1596ab);
    }
  }
  return local_4;
}

Assistant:

int VP8LBuildHuffmanTable(HuffmanTables* const root_table, int root_bits,
                          const int code_lengths[], int code_lengths_size) {
  const int total_size =
      BuildHuffmanTable(NULL, root_bits, code_lengths, code_lengths_size, NULL);
  assert(code_lengths_size <= MAX_CODE_LENGTHS_SIZE);
  if (total_size == 0 || root_table == NULL) return total_size;

  if (root_table->curr_segment->curr_table + total_size >=
      root_table->curr_segment->start + root_table->curr_segment->size) {
    // If 'root_table' does not have enough memory, allocate a new segment.
    // The available part of root_table->curr_segment is left unused because we
    // need a contiguous buffer.
    const int segment_size = root_table->curr_segment->size;
    struct HuffmanTablesSegment* next =
        (HuffmanTablesSegment*)WebPSafeMalloc(1, sizeof(*next));
    if (next == NULL) return 0;
    // Fill the new segment.
    // We need at least 'total_size' but if that value is small, it is better to
    // allocate a big chunk to prevent more allocations later. 'segment_size' is
    // therefore chosen (any other arbitrary value could be chosen).
    next->size = total_size > segment_size ? total_size : segment_size;
    next->start =
        (HuffmanCode*)WebPSafeMalloc(next->size, sizeof(*next->start));
    if (next->start == NULL) {
      WebPSafeFree(next);
      return 0;
    }
    next->curr_table = next->start;
    next->next = NULL;
    // Point to the new segment.
    root_table->curr_segment->next = next;
    root_table->curr_segment = next;
  }
  if (code_lengths_size <= SORTED_SIZE_CUTOFF) {
    // use local stack-allocated array.
    uint16_t sorted[SORTED_SIZE_CUTOFF];
    BuildHuffmanTable(root_table->curr_segment->curr_table, root_bits,
                      code_lengths, code_lengths_size, sorted);
  } else {  // rare case. Use heap allocation.
    uint16_t* const sorted =
        (uint16_t*)WebPSafeMalloc(code_lengths_size, sizeof(*sorted));
    if (sorted == NULL) return 0;
    BuildHuffmanTable(root_table->curr_segment->curr_table, root_bits,
                      code_lengths, code_lengths_size, sorted);
    WebPSafeFree(sorted);
  }
  return total_size;
}